

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int32_t nghttp2_session_get_stream_effective_recv_data_length
                  (nghttp2_session *session,int32_t stream_id)

{
  int iVar1;
  nghttp2_stream *pnVar2;
  
  pnVar2 = nghttp2_session_get_stream(session,stream_id);
  if (pnVar2 != (nghttp2_stream *)0x0) {
    iVar1 = 0;
    if (0 < pnVar2->recv_window_size) {
      iVar1 = pnVar2->recv_window_size;
    }
    return iVar1;
  }
  return -1;
}

Assistant:

int32_t
nghttp2_session_get_stream_effective_recv_data_length(nghttp2_session *session,
                                                      int32_t stream_id) {
  nghttp2_stream *stream;
  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream == NULL) {
    return -1;
  }
  return stream->recv_window_size < 0 ? 0 : stream->recv_window_size;
}